

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O3

void __thiscall
btIDebugDraw::drawCylinder
          (btIDebugDraw *this,btScalar radius,btScalar halfHeight,int upAxis,btTransform *transform,
          btVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btVector3 *pbVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float local_1d8 [10];
  btVector3 *local_1b0;
  float local_1a8 [4];
  undefined8 local_198;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  local_188 = *(undefined8 *)(transform->m_origin).m_floats;
  uStack_180 = 0;
  fVar1 = (transform->m_origin).m_floats[2];
  lVar11 = (long)upAxis;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_1a8[2] = 0.0;
  local_1a8[3] = 0.0;
  local_1a8[lVar11] = halfHeight;
  local_1d8[4] = 0.0;
  local_1d8[5] = 0.0;
  local_1d8[6] = 0.0;
  local_1d8[7] = 0.0;
  local_1b0 = color;
  local_1d8[lVar11 + 4] = -halfHeight;
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  local_1d8[3] = 0.0;
  local_1d8[lVar11] = halfHeight;
  lVar13 = (long)(((upAxis + 1) / 3) * -3 + upAxis + 1);
  lVar12 = (long)(((upAxis + 2) / 3) * -3 + upAxis + 2);
  uVar14 = 0xffffffe2;
  local_198 = lVar11;
  do {
    uVar14 = uVar14 + 0x1e;
    local_178 = (float)(int)uVar14 * 0.017453292;
    fVar15 = sinf(local_178);
    local_1d8[lVar13 + 4] = fVar15 * radius;
    local_1d8[lVar13] = fVar15 * radius;
    fVar15 = cosf(local_178);
    local_1d8[lVar12 + 4] = fVar15 * radius;
    local_1d8[lVar12] = fVar15 * radius;
    fVar7 = (transform->m_basis).m_el[0].m_floats[0];
    fVar8 = (transform->m_basis).m_el[0].m_floats[1];
    fVar9 = (transform->m_basis).m_el[0].m_floats[2];
    fVar15 = (transform->m_basis).m_el[2].m_floats[0];
    fVar2 = (transform->m_basis).m_el[2].m_floats[1];
    fVar3 = (transform->m_basis).m_el[2].m_floats[2];
    fVar4 = (transform->m_basis).m_el[1].m_floats[1];
    fVar5 = (transform->m_basis).m_el[1].m_floats[0];
    fVar6 = (transform->m_basis).m_el[1].m_floats[2];
    local_1e8._4_4_ =
         local_1d8[6] * fVar6 + local_1d8[4] * fVar5 + local_1d8[5] * fVar4 + local_188._4_4_;
    local_1e8._0_4_ =
         local_1d8[6] * fVar9 + local_1d8[4] * fVar7 + local_1d8[5] * fVar8 + (float)local_188;
    fStack_1e0 = fVar3 * local_1d8[6] + fVar15 * local_1d8[4] + local_1d8[5] * fVar2 + fVar1;
    unique0x100001b9 = 0;
    local_1f8._4_4_ =
         local_1d8[2] * fVar6 + local_1d8[0] * fVar5 + local_1d8[1] * fVar4 + local_188._4_4_;
    local_1f8._0_4_ =
         local_1d8[2] * fVar9 + local_1d8[0] * fVar7 + local_1d8[1] * fVar8 + (float)local_188;
    fStack_1f0 = fVar3 * local_1d8[2] + fVar15 * local_1d8[0] + fVar2 * local_1d8[1] + fVar1;
    unique0x100001dd = 0;
    (*this->_vptr_btIDebugDraw[4])(this,local_1e8,local_1f8,local_1b0);
  } while (uVar14 < 0x14a);
  _local_1e8 = ZEXT816(0);
  *(undefined4 *)(local_1e8 + local_198 * 4) = 0x3f800000;
  _local_1f8 = ZEXT816(0);
  *(undefined4 *)(local_1f8 + lVar13 * 4) = 0x3f800000;
  pbVar10 = local_1b0;
  local_98 = ZEXT416((uint)local_1a8[1]);
  fVar7 = (transform->m_basis).m_el[0].m_floats[0];
  fVar8 = (transform->m_basis).m_el[0].m_floats[1];
  fVar9 = (transform->m_basis).m_el[0].m_floats[2];
  fVar15 = (transform->m_basis).m_el[2].m_floats[0];
  fVar2 = (transform->m_basis).m_el[2].m_floats[1];
  local_108 = ZEXT416((uint)local_1a8[0]);
  fVar3 = (transform->m_basis).m_el[2].m_floats[2];
  local_168 = ZEXT416((uint)local_1a8[2]);
  local_178 = local_1a8[1];
  fStack_174 = local_1a8[1];
  fStack_170 = local_1a8[1];
  fStack_16c = local_1a8[1];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  fVar5 = (transform->m_basis).m_el[1].m_floats[0];
  local_198._0_4_ = local_1a8[0];
  local_198._4_4_ = local_1a8[0];
  fStack_190 = local_1a8[0];
  fStack_18c = local_1a8[0];
  fVar6 = (transform->m_basis).m_el[1].m_floats[2];
  local_78 = local_1a8[2];
  fStack_74 = local_1a8[2];
  fStack_70 = local_1a8[2];
  fStack_6c = local_1a8[2];
  local_40._4_4_ =
       local_188._4_4_ - (fVar6 * local_1a8[2] + fVar5 * local_1a8[0] + local_1a8[1] * fVar4);
  local_40._0_4_ =
       (float)local_188 - (fVar9 * local_1a8[2] + fVar7 * local_1a8[0] + local_1a8[1] * fVar8);
  local_40._8_4_ = fVar1 - (fVar3 * local_1a8[2] + fVar15 * local_1a8[0] + local_1a8[1] * fVar2);
  local_40._12_4_ = 0;
  local_b8 = ZEXT416((uint)local_1e8._4_4_);
  local_88 = (float)local_1e8._4_4_;
  fStack_84 = (float)local_1e8._4_4_;
  fStack_80 = (float)local_1e8._4_4_;
  fStack_7c = (float)local_1e8._4_4_;
  local_c8 = ZEXT416((uint)local_1e8._0_4_);
  local_a8 = (float)local_1e8._0_4_;
  fStack_a4 = (float)local_1e8._0_4_;
  fStack_a0 = (float)local_1e8._0_4_;
  fStack_9c = (float)local_1e8._0_4_;
  local_d8 = ZEXT416((uint)fStack_1e0);
  local_e8 = fStack_1e0;
  fStack_e4 = fStack_1e0;
  fStack_e0 = fStack_1e0;
  fStack_dc = fStack_1e0;
  local_50._4_4_ =
       fVar6 * fStack_1e0 + fVar5 * (float)local_1e8._0_4_ + fVar4 * (float)local_1e8._4_4_;
  local_50._0_4_ =
       fVar9 * fStack_1e0 + fVar7 * (float)local_1e8._0_4_ + fVar8 * (float)local_1e8._4_4_;
  local_50._8_4_ =
       fVar3 * fStack_1e0 + fVar15 * (float)local_1e8._0_4_ + fVar2 * (float)local_1e8._4_4_;
  local_50._12_4_ = 0;
  local_158 = ZEXT416((uint)local_1f8._4_4_);
  local_f8 = (float)local_1f8._4_4_;
  fStack_f4 = (float)local_1f8._4_4_;
  fStack_f0 = (float)local_1f8._4_4_;
  fStack_ec = (float)local_1f8._4_4_;
  local_128 = ZEXT416((uint)local_1f8._0_4_);
  local_118 = (float)local_1f8._0_4_;
  fStack_114 = (float)local_1f8._0_4_;
  fStack_110 = (float)local_1f8._0_4_;
  fStack_10c = (float)local_1f8._0_4_;
  local_138 = ZEXT416((uint)fStack_1f0);
  local_148 = fStack_1f0;
  fStack_144 = fStack_1f0;
  fStack_140 = fStack_1f0;
  fStack_13c = fStack_1f0;
  local_60._4_4_ =
       fVar6 * fStack_1f0 + fVar5 * (float)local_1f8._0_4_ + fVar4 * (float)local_1f8._4_4_;
  local_60._0_4_ =
       fVar9 * fStack_1f0 + fVar7 * (float)local_1f8._0_4_ + fVar8 * (float)local_1f8._4_4_;
  local_60._8_4_ =
       fVar3 * fStack_1f0 + fVar15 * (float)local_1f8._0_4_ + fVar2 * (float)local_1f8._4_4_;
  local_60._12_4_ = 0;
  (*this->_vptr_btIDebugDraw[0x11])
            (radius,radius,0,0x40c90fdb,0x41200000,this,local_40,local_50,local_60,local_1b0,0);
  fVar15 = (transform->m_basis).m_el[2].m_floats[1];
  fVar2 = (transform->m_basis).m_el[2].m_floats[0];
  fVar3 = (transform->m_basis).m_el[2].m_floats[2];
  fVar7 = (transform->m_basis).m_el[0].m_floats[1];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  fVar8 = (transform->m_basis).m_el[0].m_floats[0];
  fVar5 = (transform->m_basis).m_el[1].m_floats[0];
  fVar9 = (transform->m_basis).m_el[0].m_floats[2];
  fVar6 = (transform->m_basis).m_el[1].m_floats[2];
  local_40._4_4_ =
       fStack_74 * fVar6 + local_198._4_4_ * fVar5 + fStack_174 * fVar4 + local_188._4_4_;
  local_40._0_4_ =
       local_78 * fVar9 + (float)local_198 * fVar8 + local_178 * fVar7 + (float)local_188;
  local_40._8_4_ =
       (float)local_168._0_4_ * fVar3 +
       (float)local_108._0_4_ * fVar2 + (float)local_98._0_4_ * fVar15 + fVar1;
  local_40._12_4_ = 0;
  local_50._4_4_ = fStack_e4 * fVar6 + fStack_a4 * fVar5 + fStack_84 * fVar4;
  local_50._0_4_ = local_e8 * fVar9 + local_a8 * fVar8 + local_88 * fVar7;
  local_50._8_4_ =
       (float)local_d8._0_4_ * fVar3 +
       (float)local_c8._0_4_ * fVar2 + (float)local_b8._0_4_ * fVar15;
  local_50._12_4_ = 0;
  local_60._4_4_ = fVar6 * fStack_144 + fVar5 * fStack_114 + fVar4 * fStack_f4;
  local_60._0_4_ = fVar9 * local_148 + fVar8 * local_118 + fVar7 * local_f8;
  local_60._8_4_ =
       fVar3 * (float)local_138._0_4_ +
       fVar2 * (float)local_128._0_4_ + (float)local_158._0_4_ * fVar15;
  local_60._12_4_ = 0;
  (*this->_vptr_btIDebugDraw[0x11])
            (radius,radius,0,0x40c90fdb,0x41200000,this,local_40,local_50,local_60,pbVar10,0);
  return;
}

Assistant:

virtual void drawCylinder(btScalar radius, btScalar halfHeight, int upAxis, const btTransform& transform, const btVector3& color)
	{
		btVector3 start = transform.getOrigin();
		btVector3	offsetHeight(0,0,0);
		offsetHeight[upAxis] = halfHeight;
		int stepDegrees=30;
		btVector3 capStart(0.f,0.f,0.f);
		capStart[upAxis] = -halfHeight;
		btVector3 capEnd(0.f,0.f,0.f);
		capEnd[upAxis] = halfHeight;

		for (int i=0;i<360;i+=stepDegrees)
		{
			capEnd[(upAxis+1)%3] = capStart[(upAxis+1)%3] = btSin(btScalar(i)*SIMD_RADS_PER_DEG)*radius;
			capEnd[(upAxis+2)%3] = capStart[(upAxis+2)%3]  = btCos(btScalar(i)*SIMD_RADS_PER_DEG)*radius;
			drawLine(start+transform.getBasis() * capStart,start+transform.getBasis() * capEnd, color);
		}
		// Drawing top and bottom caps of the cylinder
		btVector3 yaxis(0,0,0);
		yaxis[upAxis] = btScalar(1.0);
		btVector3 xaxis(0,0,0);
		xaxis[(upAxis+1)%3] = btScalar(1.0);
		drawArc(start-transform.getBasis()*(offsetHeight),transform.getBasis()*yaxis,transform.getBasis()*xaxis,radius,radius,0,SIMD_2_PI,color,false,btScalar(10.0));
		drawArc(start+transform.getBasis()*(offsetHeight),transform.getBasis()*yaxis,transform.getBasis()*xaxis,radius,radius,0,SIMD_2_PI,color,false,btScalar(10.0));
	}